

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewClasses::initProgramObject
          (TextureViewTestViewClasses *this,GLenum texture_internalformat,GLenum view_internalformat
          )

{
  int iVar1;
  uint uVar2;
  _sampler_type _Var3;
  deUint32 dVar4;
  int iVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ulong uVar8;
  char *pcVar9;
  TestError *pTVar10;
  GLint view_uniform_location;
  GLint texture_uniform_location;
  GLint link_status;
  uint n_varying_names;
  char *varying_names [2];
  undefined8 local_e0;
  char *vs_body_raw_ptr;
  GLint compile_status;
  allocator<char> local_c1;
  string local_c0 [8];
  string vs_body;
  size_t token_position;
  char *vs_template_body;
  char *token_view_swizzle;
  char *token_view_sampler;
  char *token_view_data_type;
  char *token_texture_swizzle;
  char *token_texture_sampler;
  char *token_texture_data_type;
  char *view_swizzle_glsl;
  char *view_sampler_glsl;
  char *view_sampler_data_type_glsl;
  _sampler_type view_sampler_type;
  uint view_n_components;
  char *texture_swizzle_glsl;
  char *texture_sampler_glsl;
  char *texture_sampler_data_type_glsl;
  _sampler_type texture_sampler_type;
  uint texture_n_components;
  Functions *gl;
  GLenum view_internalformat_local;
  GLenum texture_internalformat_local;
  TextureViewTestViewClasses *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar1);
  uVar2 = TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
  _Var3 = TextureViewUtilities::getSamplerTypeForInternalformat(texture_internalformat);
  TextureViewUtilities::getGLSLDataTypeForSamplerType(_Var3,uVar2);
  TextureViewUtilities::getGLSLTypeForSamplerType(_Var3);
  uVar2 = TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
  _Var3 = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
  TextureViewUtilities::getGLSLDataTypeForSamplerType(_Var3,uVar2);
  TextureViewUtilities::getGLSLTypeForSamplerType(_Var3);
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             "#version 400\n\nuniform TEXTURE_SAMPLER texture;\nuniform VIEW_SAMPLER    view;\n\nout TEXTURE_DATA_TYPE out_texture_data;\nout VIEW_DATA_TYPE    out_view_data;\n\nvoid main()\n{\n    ivec2 uv = ivec2(gl_VertexID % 4,\n                     gl_VertexID / 4);\n\n    out_texture_data = texelFetch(texture, uv, 0).TEXTURE_SWIZZLE;\n    out_view_data    = texelFetch(view,    uv, 0).VIEW_SWIZZLE;\n}\n"
             ,&local_c1);
  std::allocator<char>::~allocator(&local_c1);
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d00), uVar8 != 0xffffffffffffffff
        ) {
    vs_body.field_2._8_8_ = uVar8;
    pcVar9 = (char *)strlen("TEXTURE_DATA_TYPE");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d12), uVar8 != 0xffffffffffffffff
        ) {
    vs_body.field_2._8_8_ = uVar8;
    pcVar9 = (char *)strlen("TEXTURE_SAMPLER");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d22), uVar8 != 0xffffffffffffffff
        ) {
    vs_body.field_2._8_8_ = uVar8;
    pcVar9 = (char *)strlen("TEXTURE_SWIZZLE");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d32), uVar8 != 0xffffffffffffffff
        ) {
    vs_body.field_2._8_8_ = uVar8;
    pcVar9 = (char *)strlen("VIEW_DATA_TYPE");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d41), uVar8 != 0xffffffffffffffff
        ) {
    vs_body.field_2._8_8_ = uVar8;
    pcVar9 = (char *)strlen("VIEW_SAMPLER");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body.field_2._8_8_ = 0xffffffffffffffff;
  while (uVar8 = std::__cxx11::string::find((char *)local_c0,0x2a60d4e),
        vs_body.field_2._8_8_ = uVar8, uVar8 != 0xffffffffffffffff) {
    pcVar9 = (char *)strlen("VIEW_SWIZZLE");
    std::__cxx11::string::replace((ulong)local_c0,uVar8,pcVar9);
  }
  vs_body_raw_ptr._0_4_ = 0;
  local_e0 = std::__cxx11::string::c_str();
  (**(code **)(lVar7 + 0x12b8))(this->m_vs_id,1,&local_e0,0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glShaderSource() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1ac9);
  (**(code **)(lVar7 + 0x248))(this->m_vs_id);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glCompileShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1acc);
  (**(code **)(lVar7 + 0xa70))(this->m_vs_id,0x8b81,&vs_body_raw_ptr);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGetShaderiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1acf);
  if ((int)vs_body_raw_ptr != 1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1ad3);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  link_status = 0x2a60ed9;
  n_varying_names = 0;
  varying_names[0]._0_4_ = 0x2a60eea;
  varying_names[0]._4_4_ = 0;
  texture_uniform_location = 2;
  (**(code **)(lVar7 + 0x14c8))(this->m_po_id,2,&link_status,0x8c8d);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glTransformFeedbackVaryings() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1adb);
  (**(code **)(lVar7 + 0x50))(0x8c8e,0,this->m_bo_id,0,this->m_view_data_offset);
  (**(code **)(lVar7 + 0x50))
            (0x8c8e,1,this->m_bo_id,this->m_view_data_offset,
             this->m_bo_size - this->m_view_data_offset);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glBindBufferRange() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1ae5);
  view_uniform_location = 0;
  (**(code **)(lVar7 + 0xce8))(this->m_po_id);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1aeb);
  (**(code **)(lVar7 + 0x9d8))(this->m_po_id,0x8b82,&view_uniform_location);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1aee);
  if (view_uniform_location != 1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"Program linking failed.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1af2);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  iVar1 = (**(code **)(lVar7 + 0xb48))(this->m_po_id,"texture");
  iVar5 = (**(code **)(lVar7 + 0xb48))(this->m_po_id,"view");
  if (iVar1 == -1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"\'texture\' uniform is considered inactive which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1afb);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  if (iVar5 == -1) {
    pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar10,"\'view\' uniform is considered inactive which is invalid",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
               ,0x1b00);
    __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lVar7 + 0x1680))(this->m_po_id);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b04);
  (**(code **)(lVar7 + 0x14f0))(iVar1,this->m_texture_unit_for_parent_texture - 0x84c0);
  (**(code **)(lVar7 + 0x14f0))(iVar5,this->m_texture_unit_for_view_texture - 0x84c0);
  dVar4 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar4,"glUniform1i() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x1b08);
  std::__cxx11::string::~string(local_c0);
  return;
}

Assistant:

void TextureViewTestViewClasses::initProgramObject(glw::GLenum texture_internalformat, glw::GLenum view_internalformat)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Determine which samplers we should be using for sampling both textures */
	const unsigned int texture_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(texture_internalformat);
	const _sampler_type texture_sampler_type =
		TextureViewUtilities::getSamplerTypeForInternalformat(texture_internalformat);
	const char* texture_sampler_data_type_glsl =
		TextureViewUtilities::getGLSLDataTypeForSamplerType(texture_sampler_type, texture_n_components);
	const char* texture_sampler_glsl = TextureViewUtilities::getGLSLTypeForSamplerType(texture_sampler_type);
	const char* texture_swizzle_glsl =
		(texture_n_components == 4) ? "xyzw" :
									  (texture_n_components == 3) ? "xyz" : (texture_n_components == 2) ? "xy" : "x";
	const unsigned int view_n_components =
		TextureViewUtilities::getAmountOfComponentsForInternalformat(view_internalformat);
	const _sampler_type view_sampler_type = TextureViewUtilities::getSamplerTypeForInternalformat(view_internalformat);
	const char*			view_sampler_data_type_glsl =
		TextureViewUtilities::getGLSLDataTypeForSamplerType(view_sampler_type, view_n_components);
	const char* view_sampler_glsl = TextureViewUtilities::getGLSLTypeForSamplerType(view_sampler_type);
	const char* view_swizzle_glsl =
		(view_n_components == 4) ? "xyzw" : (view_n_components == 3) ? "xyz" : (view_n_components == 2) ? "xy" : "x";

	/* Form vertex shader body */
	const char* token_texture_data_type = "TEXTURE_DATA_TYPE";
	const char* token_texture_sampler   = "TEXTURE_SAMPLER";
	const char* token_texture_swizzle   = "TEXTURE_SWIZZLE";
	const char* token_view_data_type	= "VIEW_DATA_TYPE";
	const char* token_view_sampler		= "VIEW_SAMPLER";
	const char* token_view_swizzle		= "VIEW_SWIZZLE";
	const char* vs_template_body		= "#version 400\n"
								   "\n"
								   "uniform TEXTURE_SAMPLER texture;\n"
								   "uniform VIEW_SAMPLER    view;\n"
								   "\n"
								   "out TEXTURE_DATA_TYPE out_texture_data;\n"
								   "out VIEW_DATA_TYPE    out_view_data;\n"
								   "\n"
								   "void main()\n"
								   "{\n"
								   "    ivec2 uv = ivec2(gl_VertexID % 4,\n"
								   "                     gl_VertexID / 4);\n"
								   "\n"
								   "    out_texture_data = texelFetch(texture, uv, 0).TEXTURE_SWIZZLE;\n"
								   "    out_view_data    = texelFetch(view,    uv, 0).VIEW_SWIZZLE;\n"
								   "}\n";

	std::size_t token_position = std::string::npos;
	std::string vs_body		   = vs_template_body;

	while ((token_position = vs_body.find(token_texture_data_type)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_data_type), texture_sampler_data_type_glsl);
	}

	while ((token_position = vs_body.find(token_texture_sampler)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_sampler), texture_sampler_glsl);
	}

	while ((token_position = vs_body.find(token_texture_swizzle)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_texture_swizzle), texture_swizzle_glsl);
	}

	while ((token_position = vs_body.find(token_view_data_type)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_data_type), view_sampler_data_type_glsl);
	}

	while ((token_position = vs_body.find(token_view_sampler)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_sampler), view_sampler_glsl);
	}

	while ((token_position = vs_body.find(token_view_swizzle)) != std::string::npos)
	{
		vs_body.replace(token_position, strlen(token_view_swizzle), view_swizzle_glsl);
	}

	/* Compile the shader */
	glw::GLint  compile_status  = GL_FALSE;
	const char* vs_body_raw_ptr = vs_body.c_str();

	gl.shaderSource(m_vs_id, 1 /* count */, &vs_body_raw_ptr, DE_NULL /* length */);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

	gl.compileShader(m_vs_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

	gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

	if (compile_status != GL_TRUE)
	{
		TCU_FAIL("Shader compilation failed");
	}

	/* Configure test program object for XFB */
	const char*		   varying_names[] = { "out_texture_data", "out_view_data" };
	const unsigned int n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	gl.transformFeedbackVaryings(m_po_id, n_varying_names, varying_names, GL_SEPARATE_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed.");

	/* Configure buffer object bindings for XFB */
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index for 'out_texture_data' */
					   m_bo_id, 0,						/* offset */
					   m_view_data_offset);				/* size */
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 1, /* index for 'out_view_data' */
					   m_bo_id, m_view_data_offset,		/* offset */
					   m_bo_size - m_view_data_offset); /* size */

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferRange() call(s) failed.");

	/* Link the program object */
	glw::GLint link_status = GL_FALSE;

	gl.linkProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(m_po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed.");
	}

	/* Configure sampler uniforms */
	glw::GLint texture_uniform_location = gl.getUniformLocation(m_po_id, "texture");
	glw::GLint view_uniform_location	= gl.getUniformLocation(m_po_id, "view");

	if (texture_uniform_location == -1)
	{
		TCU_FAIL("'texture' uniform is considered inactive which is invalid");
	}

	if (view_uniform_location == -1)
	{
		TCU_FAIL("'view' uniform is considered inactive which is invalid");
	}

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	gl.uniform1i(texture_uniform_location, m_texture_unit_for_parent_texture - GL_TEXTURE0);
	gl.uniform1i(view_uniform_location, m_texture_unit_for_view_texture - GL_TEXTURE0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i() call(s) failed.");
}